

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_getObjDesc(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  char *str;
  PyObject *obj;
  PyObject *args_local;
  PyObject *self_local;
  
  obj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:getObjDesc",&str);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    uVar2 = PyCapsule_GetName(str);
    uVar2 = PyCapsule_GetPointer(str,uVar2);
    self_local = (PyObject *)_Py_BuildValue_SizeT("s",uVar2);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_getObjDesc(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {

    PyObject *obj;
    char *str;

    if (!PyArg_ParseTuple(args, (char *)"O:getObjDesc", &obj))
        return NULL;
    str = PyCapsule_GetPointer(obj, PyCapsule_GetName(obj));
    return Py_BuildValue((char *)"s", str);
}